

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
FastHufDecoder_buildTables
          (exr_const_context_t_conflict pctxt,FastHufDecoder *fhd,uint64_t *base,uint64_t *offset)

{
  ulong uVar1;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  uint64_t id;
  int codeLen;
  uint64_t value;
  uint64_t i_2;
  int i_1;
  int i;
  int minIdx;
  uint local_4c;
  ulong local_40;
  int local_34;
  int local_30;
  int local_2c;
  
  local_2c = 0xc;
  for (local_30 = 0; local_30 < 0x3b; local_30 = local_30 + 1) {
    if (*(long *)(in_RDX + (long)local_30 * 8) == -1) {
      *(undefined8 *)(in_RSI + 0x40010 + (long)local_30 * 8) = 0xffffffffffffffff;
    }
    else {
      *(long *)(in_RSI + 0x40010 + (long)local_30 * 8) =
           *(long *)(in_RDX + (long)local_30 * 8) << (0x40U - (char)local_30 & 0x3f);
    }
  }
  *(undefined8 *)(in_RSI + 0x401e8) = 0;
  *(long *)(in_RSI + 0x401f0) = *in_RCX - *(long *)(in_RSI + 0x40010);
  for (local_34 = 1; local_34 < 0x3b; local_34 = local_34 + 1) {
    *(ulong *)(in_RSI + 0x401f0 + (long)local_34 * 8) =
         in_RCX[local_34] -
         (*(ulong *)(in_RSI + 0x40010 + (long)local_34 * 8) >> (0x40U - (char)local_34 & 0x3f));
  }
  local_40 = 0;
  do {
    if (0xfff < local_40) {
      while( true ) {
        bVar2 = false;
        if (0 < local_2c) {
          bVar2 = *(long *)(in_RSI + 0x40010 + (long)local_2c * 8) == -1;
        }
        if (!bVar2) break;
        local_2c = local_2c + -1;
      }
      if (local_2c < 0) {
        *(undefined8 *)(in_RSI + 0x453c8) = 0xffffffffffffffff;
      }
      else {
        *(undefined8 *)(in_RSI + 0x453c8) = *(undefined8 *)(in_RSI + 0x40010 + (long)local_2c * 8);
      }
      return 0;
    }
    *(undefined4 *)(in_RSI + 0x403c8 + local_40 * 4) = 0xffff;
    *(undefined1 *)(in_RSI + 0x443c8 + local_40) = 0;
    for (local_4c = (uint)*(byte *)(in_RSI + 8); (int)local_4c <= (int)(uint)*(byte *)(in_RSI + 9);
        local_4c = local_4c + 1) {
      if (*(ulong *)(in_RSI + 0x40010 + (long)(int)local_4c * 8) <= local_40 << 0x34) {
        *(char *)(in_RSI + 0x443c8 + local_40) = (char)local_4c;
        uVar1 = *(long *)(in_RSI + 0x401f0 + (long)(int)local_4c * 8) +
                ((local_40 << 0x34) >> (0x40U - (char)local_4c & 0x3f));
        if (*(uint *)(in_RSI + 4) <= uVar1) {
          if (in_RDI != 0) {
            (**(code **)(in_RDI + 0x48))(in_RDI,0x17,"Huffman decode error (Overrun)");
          }
          return 0x17;
        }
        *(undefined4 *)(in_RSI + 0x403c8 + local_40 * 4) = *(undefined4 *)(in_RSI + 0xc + uVar1 * 4)
        ;
        break;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

static exr_result_t
FastHufDecoder_buildTables (
    exr_const_context_t pctxt,
    FastHufDecoder*     fhd,
    uint64_t*           base,
    uint64_t*           offset)
{
    int minIdx = TABLE_LOOKUP_BITS;

    //
    // Build the 'left justified' base table, by shifting base left..
    //

    for (int i = 0; i <= MAX_CODE_LEN; ++i)
    {
        if (base[i] != 0xffffffffffffffffULL)
        {
            fhd->_ljBase[i] = base[i] << (64 - i);
        }
        else
        {
            //
            // Unused code length - insert dummy values
            //

            fhd->_ljBase[i] = 0xffffffffffffffffULL;
        }
    }
    fhd->_ljBase[MAX_CODE_LEN + 1] = 0; /* sentinel for brute force lookup */

    //
    // Combine some terms into a big fat constant, which for
    // lack of a better term we'll call the 'left justified'
    // offset table (because it serves the same function
    // as 'offset', when using the left justified base table.
    //

    fhd->_ljOffset[0] = offset[0] - fhd->_ljBase[0];
    for (int i = 1; i <= MAX_CODE_LEN; ++i)
        fhd->_ljOffset[i] = offset[i] - (fhd->_ljBase[i] >> (64 - i));

    //
    // Build the acceleration tables for the lookups of
    // short codes ( <= TABLE_LOOKUP_BITS long)
    //

    for (uint64_t i = 0; i < 1 << TABLE_LOOKUP_BITS; ++i)
    {
        uint64_t value = i << INDEX_BIT_SHIFT;

        fhd->_tableSymbol[i] = 0xffff;
        fhd->_tableCodeLen[i] = 0;

        for (int codeLen = fhd->_minCodeLength; codeLen <= fhd->_maxCodeLength;
             ++codeLen)
        {
            if (fhd->_ljBase[codeLen] <= value)
            {
                fhd->_tableCodeLen[i] = codeLen;
                uint64_t id =
                    fhd->_ljOffset[codeLen] + (value >> (64 - codeLen));
                if (id < (uint64_t) (fhd->_numSymbols))
                {
                    fhd->_tableSymbol[i] = fhd->_idToSymbol[id];
                }
                else
                {
                    if (pctxt)
                        pctxt->print_error (
                            pctxt,
                            EXR_ERR_CORRUPT_CHUNK,
                            "Huffman decode error (Overrun)");
                    return EXR_ERR_CORRUPT_CHUNK;
                }
                break;
            }
        }
    }

    //
    // Store the smallest value in the table that points to real data.
    // This should be the entry for the largest length that has
    // valid data (in our case, non-dummy _ljBase)
    //

    while (minIdx > 0 && fhd->_ljBase[minIdx] == 0xffffffffffffffffULL)
        minIdx--;

    if (minIdx < 0)
    {
        //
        // Error, no codes with lengths 0-TABLE_LOOKUP_BITS used.
        // Set the min value such that the table is never tested.
        //

        fhd->_tableMin = 0xffffffffffffffffULL;
    }
    else { fhd->_tableMin = fhd->_ljBase[minIdx]; }
    return EXR_ERR_SUCCESS;
}